

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<bool> __thiscall
kj::HttpServer::Connection::sendError
          (Connection *this,uint statusCode,StringPtr statusText,String *body)

{
  ArrayPtr<const_char> word3;
  ArrayPtr<const_kj::StringPtr> connectionHeaders;
  undefined8 uVar1;
  long lVar2;
  Connection *pCVar3;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  size_t sVar4;
  PromiseNode *extraout_RDX_03;
  ulong elementCount;
  char *pcVar5;
  undefined4 in_register_00000034;
  long *in_R9;
  anon_unknown_31 *paVar6;
  HttpOutputStream *this_00;
  Own<kj::_::TransformPromiseNode<bool,_kj::_::Void,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_c__:4982:36),_kj::_::PropagateException>_>
  OVar7;
  Promise<bool> PVar8;
  StringPtr value;
  StringPtr value_00;
  StringPtr value_01;
  ArrayPtr<const_char> word1;
  ArrayPtr<const_char> word2;
  CappedArray<char,_14UL> statusCodeStr;
  HttpHeaders failed;
  undefined1 local_118 [20];
  undefined4 uStack_104;
  long lStack_100;
  undefined8 *local_f8;
  uint local_ec;
  String local_e8;
  String local_c8;
  Connection *local_b0;
  StringPtr *local_a8;
  size_t sStack_a0;
  HttpHeaders local_90;
  
  local_ec = (uint)statusText.content.ptr;
  local_90.table =
       *(HttpHeaderTable **)(*(long *)(CONCAT44(in_register_00000034,statusCode) + 8) + 0x10);
  elementCount = (ulong)((long)((local_90.table)->namesById).builder.pos -
                        (long)((local_90.table)->namesById).builder.ptr) >> 4 & 0xffffffff;
  local_b0 = this;
  local_90.indexedHeaders.ptr =
       (StringPtr *)
       _::HeapArrayDisposer::allocateImpl
                 (0x10,elementCount,elementCount,
                  _::HeapArrayDisposer::Allocate_<kj::StringPtr,_false,_false>::construct,
                  _::HeapArrayDisposer::Allocate_<kj::StringPtr,_false,_false>::destruct);
  local_90.indexedHeaders.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_90.unindexedHeaders.builder.ptr = (Header *)0x0;
  local_90.unindexedHeaders.builder.pos = (RemoveConst<kj::HttpHeaders::Header> *)0x0;
  local_90.unindexedHeaders.builder.endPtr = (Header *)0x0;
  local_90.ownedStrings.builder.ptr = (Array<char> *)0x0;
  local_90.ownedStrings.builder.pos = (RemoveConst<kj::Array<char>_> *)0x0;
  local_90.ownedStrings.builder.endPtr = (Array<char> *)0x0;
  value.content.size_ = extraout_RDX;
  value.content.ptr = (char *)0x6;
  local_90.indexedHeaders.size_ = elementCount;
  anon_unknown_31::requireValidHeaderValue((anon_unknown_31 *)"close",value);
  ((local_90.indexedHeaders.ptr)->content).ptr = "close";
  ((local_90.indexedHeaders.ptr)->content).size_ = 6;
  local_118._0_8_ = (AsyncOutputStream *)0x0;
  if (in_R9[1] != 0) {
    local_118._0_8_ = (AsyncOutputStream *)(in_R9[1] - 1);
  }
  str<unsigned_long>((String *)(local_118 + 0x10),(unsigned_long *)local_118);
  paVar6 = stack0xfffffffffffffef8;
  if (lStack_100 == 0) {
    paVar6 = (anon_unknown_31 *)0x36d124;
  }
  pcVar5 = (char *)(lStack_100 + (ulong)(lStack_100 == 0));
  value_00.content.size_ = extraout_RDX_00;
  value_00.content.ptr = pcVar5;
  anon_unknown_31::requireValidHeaderValue(paVar6,value_00);
  local_90.indexedHeaders.ptr[5].content.ptr = (char *)paVar6;
  local_90.indexedHeaders.ptr[5].content.size_ = (size_t)pcVar5;
  HttpHeaders::takeOwnership(&local_90,(String *)(local_118 + 0x10));
  lVar2 = lStack_100;
  paVar6 = stack0xfffffffffffffef8;
  sVar4 = extraout_RDX_01;
  if (stack0xfffffffffffffef8 != (anon_unknown_31 *)0x0) {
    stack0xfffffffffffffef8 = (anon_unknown_31 *)0x0;
    lStack_100 = 0;
    (**(code **)*local_f8)(local_f8,paVar6,1,lVar2,lVar2,0);
    sVar4 = extraout_RDX_02;
  }
  value_01.content.size_ = sVar4;
  value_01.content.ptr = &DAT_0000000b;
  anon_unknown_31::requireValidHeaderValue((anon_unknown_31 *)"text/plain",value_01);
  local_90.indexedHeaders.ptr[0xe].content.ptr = "text/plain";
  local_90.indexedHeaders.ptr[0xe].content.size_ = 0xb;
  local_a8 = (StringPtr *)0x0;
  sStack_a0 = 0;
  _::Stringifier::operator*
            ((CappedArray<char,_14UL> *)(local_118 + 0x10),(Stringifier *)&_::STR,local_ec);
  local_118._8_8_ = (long)&body[-1].content.disposer + 7;
  word3.size_ = local_118._8_8_;
  word3.ptr = (char *)statusText.content.size_;
  connectionHeaders.size_ = sStack_a0;
  connectionHeaders.ptr = local_a8;
  word1.size_ = 8;
  word1.ptr = "HTTP/1.1";
  word2.size_ = (size_t)stack0xfffffffffffffef8;
  word2.ptr = (char *)&lStack_100;
  local_118._0_8_ = (AsyncOutputStream *)statusText.content.size_;
  HttpHeaders::serialize(&local_e8,&local_90,word1,word2,word3,connectionHeaders);
  this_00 = (HttpOutputStream *)(CONCAT44(in_register_00000034,statusCode) + 0xe8);
  anon_unknown_31::HttpOutputStream::writeHeaders(this_00,&local_e8);
  sVar4 = local_e8.content.size_;
  pcVar5 = local_e8.content.ptr;
  if (local_e8.content.ptr != (char *)0x0) {
    local_e8.content.ptr = (char *)0x0;
    local_e8.content.size_ = 0;
    (**(local_e8.content.disposer)->_vptr_ArrayDisposer)
              (local_e8.content.disposer,pcVar5,1,sVar4,sVar4,0);
  }
  local_c8.content.ptr = (char *)*in_R9;
  local_c8.content.size_ = in_R9[1];
  local_c8.content.disposer = (ArrayDisposer *)in_R9[2];
  *in_R9 = 0;
  in_R9[1] = 0;
  anon_unknown_31::HttpOutputStream::writeBodyData(this_00,&local_c8);
  sVar4 = local_c8.content.size_;
  pcVar5 = local_c8.content.ptr;
  if (local_c8.content.ptr != (char *)0x0) {
    local_c8.content.ptr = (char *)0x0;
    local_c8.content.size_ = 0;
    (**(local_c8.content.disposer)->_vptr_ArrayDisposer)
              (local_c8.content.disposer,pcVar5,1,sVar4,sVar4,0);
  }
  anon_unknown_31::HttpOutputStream::finishBody(this_00);
  anon_unknown_31::HttpOutputStream::flush((HttpOutputStream *)local_118);
  pCVar3 = local_b0;
  OVar7 = heap<kj::_::TransformPromiseNode<bool,kj::_::Void,kj::HttpServer::Connection::sendError(unsigned_int,kj::StringPtr,kj::String)::_lambda()_1_,kj::_::PropagateException>,kj::Own<kj::_::PromiseNode>,kj::HttpServer::Connection::sendError(unsigned_int,kj::StringPtr,kj::String)::_lambda()_1_,kj::_::PropagateException>
                    ((Own<kj::_::PromiseNode> *)(local_118 + 0x10),
                     (anon_class_1_0_00000001_for_func *)local_118,(PropagateException *)&local_a8);
  uVar1 = local_118._8_8_;
  *(undefined4 *)&(pCVar3->super_Response)._vptr_Response = local_118._16_4_;
  *(undefined4 *)((long)&(pCVar3->super_Response)._vptr_Response + 4) = uStack_104;
  *(undefined4 *)&pCVar3->server = (undefined4)lStack_100;
  *(undefined4 *)((long)&pCVar3->server + 4) = lStack_100._4_4_;
  if ((Disposer *)local_118._8_8_ != (Disposer *)0x0) {
    local_118._8_8_ = (Disposer *)0x0;
    (***(_func_int ***)local_118._0_8_)
              (local_118._0_8_,(*(_func_int ***)uVar1)[-2] + (long)(_func_int ***)uVar1,OVar7.ptr);
  }
  HttpHeaders::~HttpHeaders(&local_90);
  PVar8.super_PromiseBase.node.ptr = extraout_RDX_03;
  PVar8.super_PromiseBase.node.disposer = (Disposer *)pCVar3;
  return (Promise<bool>)PVar8.super_PromiseBase.node;
}

Assistant:

kj::Promise<bool> sendError(uint statusCode, kj::StringPtr statusText, kj::String body) {
    HttpHeaders failed(server.requestHeaderTable);
    failed.set(HttpHeaderId::CONNECTION, "close");
    failed.set(HttpHeaderId::CONTENT_LENGTH, kj::str(body.size()));

    failed.set(HttpHeaderId::CONTENT_TYPE, "text/plain");

    httpOutput.writeHeaders(failed.serializeResponse(statusCode, statusText));
    httpOutput.writeBodyData(kj::mv(body));
    httpOutput.finishBody();
    return httpOutput.flush().then([]() { return false; });  // loop ends after flush
  }